

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_event_init__posix(ma_context *pContext,ma_event *pEvent)

{
  int iVar1;
  int result;
  ma_event *pEvent_local;
  ma_context *pContext_local;
  
  iVar1 = (*(pContext->field_22).posix.pthread_mutex_init)(&pEvent->field_1,0);
  if (iVar1 == 0) {
    iVar1 = (*(pContext->field_22).posix.pthread_cond_init)
                      ((undefined1 *)((long)&pEvent->field_1 + 0x28),0);
    if (iVar1 == 0) {
      (pEvent->field_1).posix.value = 0;
      pContext_local._4_4_ = 0;
    }
    else {
      (*(pEvent->pContext->field_22).posix.pthread_mutex_destroy)(&pEvent->field_1);
      pContext_local._4_4_ = ma_result_from_errno(iVar1);
    }
  }
  else {
    pContext_local._4_4_ = ma_result_from_errno(iVar1);
  }
  return pContext_local._4_4_;
}

Assistant:

static ma_result ma_event_init__posix(ma_context* pContext, ma_event* pEvent)
{
    int result;

    result = ((ma_pthread_mutex_init_proc)pContext->posix.pthread_mutex_init)(&pEvent->posix.mutex, NULL);
    if (result != 0) {
        return ma_result_from_errno(result);
    }

    result = ((ma_pthread_cond_init_proc)pContext->posix.pthread_cond_init)(&pEvent->posix.condition, NULL);
    if (result != 0) {
        ((ma_pthread_mutex_destroy_proc)pEvent->pContext->posix.pthread_mutex_destroy)(&pEvent->posix.mutex);
        return ma_result_from_errno(result);
    }

    pEvent->posix.value = 0;
    return MA_SUCCESS;
}